

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,_2,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,int *parentBufferIndices,
          int *childBufferIndices,int *probabilityIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  int *piVar14;
  double **ppdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double dVar19;
  double dVar20;
  uint uVar21;
  double *pdVar22;
  double *pdVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int k;
  long lVar30;
  undefined1 (*pauVar31) [16];
  long lVar32;
  int i;
  long lVar33;
  ulong uVar34;
  long lVar35;
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  VecUnion vu_m [6] [2];
  double local_f8 [8];
  undefined1 local_b8 [16];
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  
  pdVar13 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
            integrationTmp;
  for (uVar26 = 0; uVar26 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar26 = uVar26 + 1
      ) {
    piVar14 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
              gPatternPartitionsStartPatterns;
    iVar10 = piVar14[partitionIndices[uVar26]];
    iVar11 = piVar14[(long)partitionIndices[uVar26] + 1];
    lVar35 = (long)iVar11;
    iVar12 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
             kStateCount;
    lVar33 = (long)iVar10;
    memset(pdVar13 + iVar12 * iVar10,0,(long)((iVar11 - iVar10) * iVar12) << 3);
    iVar12 = cumulativeScaleIndices[uVar26];
    iVar27 = childBufferIndices[uVar26];
    pdVar22 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
              gTransitionMatrices[probabilityIndices[uVar26]];
    ppdVar15 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
               gPartials;
    pdVar16 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
              gCategoryWeights[categoryWeightsIndices[uVar26]];
    pdVar17 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
              gStateFrequencies[stateFrequenciesIndices[uVar26]];
    pdVar23 = ppdVar15[parentBufferIndices[uVar26]];
    lVar25 = lVar33;
    if ((iVar27 < (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
                  kTipCount) &&
       (piVar14 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
                  gTipStates[iVar27], piVar14 != (int *)0x0)) {
      uVar34 = lVar33 * 4;
      pdVar23 = pdVar23 + lVar33 * 4;
      for (lVar29 = 0;
          lVar29 < (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>
                   .kCategoryCount; lVar29 = lVar29 + 1) {
        for (lVar30 = 0; lVar28 = lVar33, pauVar31 = (undefined1 (*) [16])(pdVar13 + lVar33 * 4),
            lVar30 != 0x30; lVar30 = lVar30 + 8) {
          *(undefined8 *)((long)local_f8 + lVar30 * 4) = *(undefined8 *)((long)pdVar22 + lVar30);
          *(undefined8 *)((long)local_f8 + lVar30 * 4 + 8) =
               *(undefined8 *)((long)pdVar22 + lVar30 + 0x30);
          *(undefined8 *)((long)local_f8 + lVar30 * 4 + 0x10) =
               *(undefined8 *)((long)pdVar22 + lVar30 + 0x60);
          *(undefined8 *)((long)local_f8 + lVar30 * 4 + 0x18) =
               *(undefined8 *)((long)pdVar22 + lVar30 + 0x90);
        }
        for (; lVar28 < lVar35; lVar28 = lVar28 + 1) {
          lVar30 = (long)piVar14[lVar28];
          dVar37 = pdVar16[lVar29];
          auVar39._0_8_ = dVar37 * *pdVar23 * local_f8[lVar30 * 4] + *(double *)*pauVar31;
          auVar39._8_8_ =
               dVar37 * pdVar23[1] * local_f8[lVar30 * 4 + 1] + *(double *)((long)*pauVar31 + 8);
          *pauVar31 = auVar39;
          pdVar18 = pdVar23 + 2;
          pdVar1 = pdVar23 + 3;
          pdVar23 = pdVar23 + 4;
          auVar38._0_8_ = dVar37 * *pdVar18 * local_f8[lVar30 * 4 + 2] + *(double *)pauVar31[1];
          auVar38._8_8_ =
               dVar37 * *pdVar1 * local_f8[lVar30 * 4 + 3] + *(double *)((long)pauVar31[1] + 8);
          pauVar31[1] = auVar38;
          pauVar31 = pauVar31 + 2;
        }
        pdVar22 = pdVar22 + 0x18;
        pdVar23 = pdVar23 + (long)((this->super_BeagleCPU4StateImpl<double,_2,_0>).
                                   super_BeagleCPUImpl<double,_2,_0>.kExtraPatterns * 2) * 2 +
                            (long)(((this->super_BeagleCPU4StateImpl<double,_2,_0>).
                                    super_BeagleCPUImpl<double,_2,_0>.kPatternCount +
                                   (iVar10 - iVar11)) * 2) * 2;
      }
    }
    else {
      pdVar18 = ppdVar15[iVar27];
      uVar21 = iVar10 * 4;
      uVar34 = (ulong)uVar21;
      lVar29 = (long)(int)uVar21;
      pdVar23 = pdVar23 + lVar29;
      for (lVar30 = 0;
          lVar30 < (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>
                   .kCategoryCount; lVar30 = lVar30 + 1) {
        for (lVar28 = 0; lVar28 != 0x30; lVar28 = lVar28 + 8) {
          *(undefined8 *)((long)local_f8 + lVar28 * 4) = *(undefined8 *)((long)pdVar22 + lVar28);
          *(undefined8 *)((long)local_f8 + lVar28 * 4 + 8) =
               *(undefined8 *)((long)pdVar22 + lVar28 + 0x30);
          *(undefined8 *)((long)local_f8 + lVar28 * 4 + 0x10) =
               *(undefined8 *)((long)pdVar22 + lVar28 + 0x60);
          *(undefined8 *)((long)local_f8 + lVar28 * 4 + 0x18) =
               *(undefined8 *)((long)pdVar22 + lVar28 + 0x90);
        }
        lVar32 = 0;
        lVar28 = (long)(int)uVar21 * 8;
        iVar27 = iVar10;
        while (iVar27 < iVar11) {
          dVar37 = *(double *)((long)pdVar18 + lVar32 * 4 + lVar28);
          dVar4 = *(double *)((long)pdVar18 + lVar32 * 4 + lVar28 + 8);
          dVar5 = *(double *)((long)pdVar18 + lVar32 * 4 + lVar28 + 0x10);
          auVar36._8_8_ = dVar5;
          auVar36._0_8_ = dVar5;
          dVar6 = *(double *)((long)pdVar18 + lVar32 * 4 + lVar28 + 0x18);
          dVar7 = pdVar16[lVar30];
          iVar27 = iVar27 + 1;
          uVar21 = uVar21 + 4;
          auVar36 = vmulpd_avx512vl(auVar36,local_b8);
          auVar42._0_8_ = dVar37 * local_f8[0] + dVar4 * local_f8[4];
          auVar42._8_8_ = dVar37 * local_f8[1] + dVar4 * local_f8[5];
          auVar36 = vaddpd_avx512vl(auVar36,auVar42);
          dVar19 = pdVar23[1];
          pdVar1 = (double *)((long)pdVar13 + lVar32 * 4 + lVar29 * 8);
          dVar20 = pdVar1[1];
          pdVar2 = (double *)((long)pdVar13 + lVar32 * 4 + lVar29 * 8);
          *pdVar2 = dVar7 * (dVar6 * local_98 + auVar36._0_8_) * *pdVar23 + *pdVar1;
          pdVar2[1] = dVar7 * (dVar6 * dStack_90 + auVar36._8_8_) * dVar19 + dVar20;
          pdVar1 = pdVar23 + 2;
          dVar19 = pdVar23[3];
          pdVar23 = pdVar23 + 4;
          pdVar2 = (double *)((long)pdVar13 + lVar32 * 4 + lVar29 * 8 + 0x10);
          dVar20 = pdVar2[1];
          pdVar3 = (double *)((long)pdVar13 + lVar32 * 4 + lVar29 * 8 + 0x10);
          *pdVar3 = dVar7 * (dVar6 * local_88 +
                            dVar5 * local_a8 + dVar37 * local_f8[2] + dVar4 * local_f8[6]) * *pdVar1
                    + *pdVar2;
          pdVar3[1] = dVar7 * (dVar6 * dStack_80 +
                              dVar5 * dStack_a0 + dVar37 * local_f8[3] + dVar4 * local_f8[7]) *
                      dVar19 + dVar20;
          lVar32 = lVar32 + 8;
        }
        iVar27 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
                 kExtraPatterns;
        if (iVar27 != 0) {
          uVar21 = uVar21 + iVar27 * 4;
          pdVar23 = pdVar23 + (long)(iVar27 * 2) * 2;
        }
        pdVar22 = pdVar22 + 0x18;
        iVar27 = ((this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
                  kPatternCount - iVar11) + iVar10;
        uVar21 = uVar21 + iVar27 * 4;
        pdVar23 = pdVar23 + (long)(iVar27 * 2) * 2;
      }
    }
    for (; lVar25 < lVar35; lVar25 = lVar25 + 1) {
      uVar21 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
               kStateCount;
      auVar36 = ZEXT816(0) << 0x40;
      uVar21 = ~((int)uVar21 >> 0x1f) & uVar21;
      for (uVar24 = 0; uVar21 != uVar24; uVar24 = uVar24 + 1) {
        auVar40._8_8_ = 0;
        auVar40._0_8_ = pdVar17[uVar24];
        auVar8._8_8_ = 0;
        auVar8._0_8_ = pdVar13[(long)(int)uVar34 + uVar24];
        auVar36 = vfmadd231sd_fma(auVar36,auVar40,auVar8);
      }
      uVar34 = (ulong)((int)uVar34 + uVar21);
      dVar37 = log(auVar36._0_8_);
      (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
      outLogLikelihoodsTmp[lVar25] = dVar37;
    }
    if (iVar12 != -1) {
      pdVar23 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
                outLogLikelihoodsTmp;
      pdVar22 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
                gScaleBuffers[iVar12];
      for (lVar25 = lVar33; lVar25 < lVar35; lVar25 = lVar25 + 1) {
        pdVar23[lVar25] = pdVar22[lVar25] + pdVar23[lVar25];
      }
    }
    auVar36 = ZEXT816(0) << 0x40;
    outSumLogLikelihoodByPartition[uVar26] = 0.0;
    pdVar23 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
              gPatternWeights;
    pdVar22 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
              outLogLikelihoodsTmp;
    for (; lVar33 < lVar35; lVar33 = lVar33 + 1) {
      auVar41._8_8_ = 0;
      auVar41._0_8_ = pdVar22[lVar33];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pdVar23[lVar33];
      auVar36 = vfmadd231sd_fma(auVar36,auVar41,auVar9);
      outSumLogLikelihoodByPartition[uVar26] = auVar36._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_4_SSE_TEMPLATE
void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::calcEdgeLogLikelihoodsByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition) {



    double* cl_p = integrationTmp;

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&cl_p[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(double));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const double* cl_r = gPartials[parIndex];
        const double* transMatrix = gTransitionMatrices[probIndex];
        const double* wt = gCategoryWeights[categoryWeightsIndex];
        const double* freqs = gStateFrequencies[stateFrequenciesIndex];


        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];

            int w = 0;
            V_Real *vcl_r = (V_Real *) (cl_r + startPattern * 4);
            for(int l = 0; l < kCategoryCount; l++) {

                VecUnion vu_m[OFFSET][2];
                SSE_PREFETCH_MATRIX(transMatrix + w, vu_m)

               V_Real *vcl_p = (V_Real *) (cl_p + startPattern * 4);

               for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];
                    V_Real vwt = VEC_SPLAT(wt[l]);

                    V_Real wtdPartials = VEC_MULT(*vcl_r++, vwt);
                    *vcl_p = VEC_MADD(vu_m[stateChild][0].vx, wtdPartials, *vcl_p);
                    vcl_p++;

                    wtdPartials = VEC_MULT(*vcl_r++, vwt);
                    *vcl_p = VEC_MADD(vu_m[stateChild][1].vx, wtdPartials, *vcl_p);
                    vcl_p++;
                }
               w += OFFSET*4;
               vcl_r += 2 * kExtraPatterns;
               vcl_r += ((kPatternCount - endPattern) + startPattern) * 2;
            }
        } else { // Integrate against a partial at the child

            const double* cl_q = gPartials[childIndex];
            V_Real * vcl_r = (V_Real *)  (cl_r + startPattern * 4);
            int v = startPattern * 4;
            int w = 0;

            for(int l = 0; l < kCategoryCount; l++) {

                V_Real * vcl_p = (V_Real *) (cl_p + startPattern * 4);

                VecUnion vu_m[OFFSET][2];
                SSE_PREFETCH_MATRIX(transMatrix + w, vu_m)

                for(int k = startPattern; k < endPattern; k++) {
                    V_Real vclp_01, vclp_23;
                    V_Real vwt = VEC_SPLAT(wt[l]);

                    V_Real vcl_q0, vcl_q1, vcl_q2, vcl_q3;
                    SSE_PREFETCH_PARTIALS(vcl_q,cl_q,v);

                    vclp_01 = VEC_MULT(vcl_q0, vu_m[0][0].vx);
                    vclp_01 = VEC_MADD(vcl_q1, vu_m[1][0].vx, vclp_01);
                    vclp_01 = VEC_MADD(vcl_q2, vu_m[2][0].vx, vclp_01);
                    vclp_01 = VEC_MADD(vcl_q3, vu_m[3][0].vx, vclp_01);
                    vclp_23 = VEC_MULT(vcl_q0, vu_m[0][1].vx);
                    vclp_23 = VEC_MADD(vcl_q1, vu_m[1][1].vx, vclp_23);
                    vclp_23 = VEC_MADD(vcl_q2, vu_m[2][1].vx, vclp_23);
                    vclp_23 = VEC_MADD(vcl_q3, vu_m[3][1].vx, vclp_23);
                    vclp_01 = VEC_MULT(vclp_01, vwt);
                    vclp_23 = VEC_MULT(vclp_23, vwt);

                    *vcl_p = VEC_MADD(vclp_01, *vcl_r++, *vcl_p);
                    vcl_p++;
                    *vcl_p = VEC_MADD(vclp_23, *vcl_r++, *vcl_p);
                    vcl_p++;

                    v += 4;
                }
                w += 4*OFFSET;
                if (kExtraPatterns) {
                    vcl_r += 2 * kExtraPatterns;
                    v += 4 * kExtraPatterns;
                }

               vcl_r += ((kPatternCount - endPattern) + startPattern) * 2;
               v     += ((kPatternCount - endPattern) + startPattern) * 4;

            }
        }

        int u = startPattern * 4;
        for(int k = startPattern; k < endPattern; k++) {
            double sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * cl_p[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const double* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }
}